

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket.hpp
# Opt level: O3

int __thiscall
asio::basic_socket<asio::ip::udp,_asio::any_io_executor>::open
          (basic_socket<asio::ip::udp,_asio::any_io_executor> *this,char *__file,int __oflag,...)

{
  int iVar1;
  error_code __ec;
  error_code ec;
  uint local_48 [2];
  error_category *local_40;
  system_error local_38 [32];
  
  local_48[0] = 0;
  local_40 = (error_category *)std::_V2::system_category();
  iVar1 = detail::reactive_socket_service<asio::ip::udp>::open
                    ((this->impl_).service_,(char *)&(this->impl_).implementation_,(int)__file,
                     local_48);
  __ec._4_4_ = 0;
  __ec._M_value = local_48[0];
  if (local_48[0] != 0) {
    __ec._M_cat = local_40;
    std::system_error::system_error(local_38,__ec,"open");
    detail::throw_exception<std::system_error>(local_38);
    iVar1 = std::system_error::~system_error(local_38);
  }
  return iVar1;
}

Assistant:

void open(const protocol_type& protocol = protocol_type())
  {
    asio::error_code ec;
    impl_.get_service().open(impl_.get_implementation(), protocol, ec);
    asio::detail::throw_error(ec, "open");
  }